

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O0

void __thiscall Win32MakefileGenerator::fixTargetExt(Win32MakefileGenerator *this)

{
  long lVar1;
  bool bVar2;
  QStringBuilder<ProString,_ProString> *str;
  long in_RDI;
  long in_FS_OFFSET;
  rvalue_ref in_stack_fffffffffffff348;
  rvalue_ref t;
  QMakeProject *in_stack_fffffffffffff350;
  QMakeProject *this_00;
  QMakeProject *in_stack_fffffffffffff358;
  ProString *in_stack_fffffffffffff360;
  ProString *this_01;
  QMakeEvaluator *in_stack_fffffffffffff368;
  QMakeEvaluator *this_02;
  ProString *in_stack_fffffffffffff370;
  ProString *this_03;
  char *in_stack_fffffffffffff388;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff348);
  QMakeProject::values(in_stack_fffffffffffff350,(ProKey *)in_stack_fffffffffffff348);
  bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x2b09c4);
  ProKey::~ProKey((ProKey *)0x2b09da);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    QString::QString((QString *)in_stack_fffffffffffff358,in_stack_fffffffffffff388);
    bVar2 = QMakeProject::isActiveConfig
                      (in_stack_fffffffffffff358,(QString *)in_stack_fffffffffffff350,
                       SUB81((ulong)in_stack_fffffffffffff348 >> 0x38,0));
    QString::~QString((QString *)0x2b0ad0);
    if (bVar2) {
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff348);
      QMakeProject::values(in_stack_fffffffffffff350,(ProKey *)in_stack_fffffffffffff348);
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff348);
      QMakeEvaluator::first(in_stack_fffffffffffff368,(ProKey *)in_stack_fffffffffffff360);
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff348);
      QMakeEvaluator::first(in_stack_fffffffffffff368,(ProKey *)in_stack_fffffffffffff360);
      ::operator+((ProString *)in_stack_fffffffffffff358,(ProString *)in_stack_fffffffffffff350);
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff348);
      QMakeEvaluator::first(in_stack_fffffffffffff368,(ProKey *)in_stack_fffffffffffff360);
      ::operator+((QStringBuilder<ProString,_ProString> *)in_stack_fffffffffffff358,
                  (ProString *)in_stack_fffffffffffff350);
      ::operator+((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)
                  in_stack_fffffffffffff358,(char *)in_stack_fffffffffffff350);
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff348);
      QMakeEvaluator::first(in_stack_fffffffffffff368,(ProKey *)in_stack_fffffffffffff360);
      ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>
                   *)in_stack_fffffffffffff358,(ProString *)in_stack_fffffffffffff350);
      ProString::
      ProString<QStringBuilder<QStringBuilder<QStringBuilder<ProString,ProString>,ProString>,char>,ProString>
                (in_stack_fffffffffffff360,
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>,_ProString>
                  *)in_stack_fffffffffffff358);
      QList<ProString>::prepend
                ((QList<ProString> *)in_stack_fffffffffffff350,in_stack_fffffffffffff348);
      ProString::~ProString((ProString *)0x2b0cda);
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>,_ProString>
      ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>,_ProString>
                         *)in_stack_fffffffffffff350);
      ProString::~ProString((ProString *)0x2b0cf4);
      ProKey::~ProKey((ProKey *)0x2b0d01);
      QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>::
      ~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>
                       *)0x2b0d0e);
      QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)
                 in_stack_fffffffffffff350);
      ProString::~ProString((ProString *)0x2b0d28);
      ProKey::~ProKey((ProKey *)0x2b0d35);
      QStringBuilder<ProString,_ProString>::~QStringBuilder
                ((QStringBuilder<ProString,_ProString> *)in_stack_fffffffffffff350);
      ProString::~ProString((ProString *)0x2b0d4f);
      ProKey::~ProKey((ProKey *)0x2b0d5c);
      ProString::~ProString((ProString *)0x2b0d69);
      ProKey::~ProKey((ProKey *)0x2b0d76);
      ProKey::~ProKey((ProKey *)0x2b0d83);
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff348);
      QMakeProject::values(in_stack_fffffffffffff350,(ProKey *)in_stack_fffffffffffff348);
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff348);
      QMakeEvaluator::first(in_stack_fffffffffffff368,(ProKey *)in_stack_fffffffffffff360);
      ::operator+((ProString *)in_stack_fffffffffffff358,(char (*) [2])in_stack_fffffffffffff350);
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff348);
      QMakeEvaluator::first(in_stack_fffffffffffff368,(ProKey *)in_stack_fffffffffffff360);
      ::operator+((QStringBuilder<ProString,_const_char_(&)[2]> *)in_stack_fffffffffffff358,
                  (ProString *)in_stack_fffffffffffff350);
      ProString::ProString<QStringBuilder<ProString,char_const(&)[2]>,ProString>
                (in_stack_fffffffffffff360,
                 (QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> *)
                 in_stack_fffffffffffff358);
      QList<ProString>::append
                ((QList<ProString> *)in_stack_fffffffffffff350,in_stack_fffffffffffff348);
      ProString::~ProString((ProString *)0x2b0ece);
      QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> *)
                 in_stack_fffffffffffff350);
      ProString::~ProString((ProString *)0x2b0ee8);
      ProKey::~ProKey((ProKey *)0x2b0ef5);
      QStringBuilder<ProString,_const_char_(&)[2]>::~QStringBuilder
                ((QStringBuilder<ProString,_const_char_(&)[2]> *)0x2b0f02);
      ProString::~ProString((ProString *)0x2b0f0f);
      ProKey::~ProKey((ProKey *)0x2b0f1c);
      ProKey::~ProKey((ProKey *)0x2b0f29);
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff348);
      QMakeEvaluator::first(in_stack_fffffffffffff368,(ProKey *)in_stack_fffffffffffff360);
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff348);
      QMakeEvaluator::first(in_stack_fffffffffffff368,(ProKey *)in_stack_fffffffffffff360);
      ::operator+((ProString *)in_stack_fffffffffffff358,(ProString *)in_stack_fffffffffffff350);
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff348);
      QMakeProject::values(in_stack_fffffffffffff350,(ProKey *)in_stack_fffffffffffff348);
      QList<ProString>::first((QList<ProString> *)in_stack_fffffffffffff350);
      ProString::operator=
                (in_stack_fffffffffffff370,
                 (QStringBuilder<ProString,_ProString> *)in_stack_fffffffffffff368);
      ProKey::~ProKey((ProKey *)0x2b103b);
      QStringBuilder<ProString,_ProString>::~QStringBuilder
                ((QStringBuilder<ProString,_ProString> *)in_stack_fffffffffffff350);
      ProString::~ProString((ProString *)0x2b1055);
      ProKey::~ProKey((ProKey *)0x2b1062);
      ProString::~ProString((ProString *)0x2b106f);
      ProKey::~ProKey((ProKey *)0x2b107c);
    }
    else {
      t = *(rvalue_ref *)(in_RDI + 0xd8);
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff350,(char *)t);
      str = (QStringBuilder<ProString,_ProString> *)
            QMakeProject::values(in_stack_fffffffffffff350,(ProKey *)t);
      this_00 = *(QMakeProject **)(in_RDI + 0xd8);
      ProKey::ProKey((ProKey *)this_00,(char *)t);
      QMakeEvaluator::first(in_stack_fffffffffffff368,(ProKey *)in_stack_fffffffffffff360);
      ::operator+((char (*) [2])str,(ProString *)this_00);
      ProString::ProString<char_const(&)[2],ProString>
                (in_stack_fffffffffffff360,(QStringBuilder<const_char_(&)[2],_ProString> *)str);
      QList<ProString>::append((QList<ProString> *)this_00,t);
      ProString::~ProString((ProString *)0x2b1153);
      QStringBuilder<const_char_(&)[2],_ProString>::~QStringBuilder
                ((QStringBuilder<const_char_(&)[2],_ProString> *)0x2b1160);
      ProString::~ProString((ProString *)0x2b116d);
      ProKey::~ProKey((ProKey *)0x2b117a);
      ProKey::~ProKey((ProKey *)0x2b1187);
      this_01 = *(ProString **)(in_RDI + 0xd8);
      ProKey::ProKey((ProKey *)this_00,(char *)t);
      QMakeEvaluator::first(in_stack_fffffffffffff368,(ProKey *)this_01);
      this_02 = *(QMakeEvaluator **)(in_RDI + 0xd8);
      ProKey::ProKey((ProKey *)this_00,(char *)t);
      QMakeEvaluator::first(this_02,(ProKey *)this_01);
      ::operator+(&str->a,(ProString *)this_00);
      this_03 = *(ProString **)(in_RDI + 0xd8);
      ProKey::ProKey((ProKey *)this_00,(char *)t);
      QMakeProject::values(this_00,(ProKey *)t);
      QList<ProString>::first((QList<ProString> *)this_00);
      ProString::operator=(this_03,(QStringBuilder<ProString,_ProString> *)this_02);
      ProKey::~ProKey((ProKey *)0x2b1287);
      QStringBuilder<ProString,_ProString>::~QStringBuilder
                ((QStringBuilder<ProString,_ProString> *)this_00);
      ProString::~ProString((ProString *)0x2b12a1);
      ProKey::~ProKey((ProKey *)0x2b12ae);
      ProString::~ProString((ProString *)0x2b12bb);
      ProKey::~ProKey((ProKey *)0x2b12c8);
      ProKey::ProKey((ProKey *)this_00,(char *)t);
      QMakeProject::values(this_00,(ProKey *)t);
      ProKey::ProKey((ProKey *)this_00,(char *)t);
      QMakeEvaluator::first(this_02,(ProKey *)this_01);
      ProKey::ProKey((ProKey *)this_00,(char *)t);
      QMakeEvaluator::first(this_02,(ProKey *)this_01);
      ::operator+(&str->a,(ProString *)this_00);
      ProString::ProString<ProString,ProString>(this_01,str);
      QList<ProString>::prepend((QList<ProString> *)this_00,t);
      ProString::~ProString((ProString *)0x2b13df);
      QStringBuilder<ProString,_ProString>::~QStringBuilder
                ((QStringBuilder<ProString,_ProString> *)this_00);
      ProString::~ProString((ProString *)0x2b13f9);
      ProKey::~ProKey((ProKey *)0x2b1406);
      ProString::~ProString((ProString *)0x2b1413);
      ProKey::~ProKey((ProKey *)0x2b1420);
      ProKey::~ProKey((ProKey *)0x2b142d);
    }
  }
  else {
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff348);
    QMakeProject::values(in_stack_fffffffffffff350,(ProKey *)in_stack_fffffffffffff348);
    ProString::ProString((ProString *)in_stack_fffffffffffff350,(char *)in_stack_fffffffffffff368);
    QList<ProString>::append
              ((QList<ProString> *)in_stack_fffffffffffff350,in_stack_fffffffffffff348);
    ProString::~ProString((ProString *)0x2b0a68);
    ProKey::~ProKey((ProKey *)0x2b0a75);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Win32MakefileGenerator::fixTargetExt()
{
    if (!project->values("QMAKE_APP_FLAG").isEmpty()) {
        project->values("TARGET_EXT").append(".exe");
    } else if (project->isActiveConfig("shared")) {
        project->values("LIB_TARGET").prepend(project->first("QMAKE_PREFIX_STATICLIB")
                                              + project->first("TARGET") + project->first("TARGET_VERSION_EXT")
                                              + '.' + project->first("QMAKE_EXTENSION_STATICLIB"));
        project->values("TARGET_EXT").append(project->first("TARGET_VERSION_EXT") + "."
                + project->first("QMAKE_EXTENSION_SHLIB"));
        project->values("TARGET").first() = project->first("QMAKE_PREFIX_SHLIB") + project->first("TARGET");
    } else {
        project->values("TARGET_EXT").append("." + project->first("QMAKE_EXTENSION_STATICLIB"));
        project->values("TARGET").first() = project->first("QMAKE_PREFIX_STATICLIB") + project->first("TARGET");
        project->values("LIB_TARGET").prepend(project->first("TARGET") + project->first("TARGET_EXT"));  // for the .prl only
    }
}